

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

TrimPositions QStringAlgorithms<const_QString>::trimmed_helper_positions(QString *str)

{
  char16_t cVar1;
  long lVar2;
  bool bVar3;
  Char *pCVar4;
  char32_t cVar5;
  Char *pCVar6;
  TrimPositions TVar7;
  
  pCVar4 = (Char *)(str->d).ptr;
  lVar2 = (str->d).size;
  pCVar6 = pCVar4 + lVar2;
  if (0 < lVar2) {
    do {
      cVar1 = pCVar6[-1].ucs;
      if (((4 < (ushort)cVar1 - 9) && (cVar1 != L' ')) &&
         (((ushort)cVar1 < 0x80 ||
          (((cVar5 = (char32_t)(ushort)cVar1, cVar5 != L'\x85' && (cVar5 != L'\xa0')) &&
           (bVar3 = QChar::isSpace_helper(cVar5), !bVar3)))))) break;
      pCVar6 = pCVar6 + -1;
    } while (pCVar4 < pCVar6);
  }
  while ((pCVar4 < pCVar6 &&
         (((cVar1 = pCVar4->ucs, (ushort)cVar1 - 9 < 5 || (cVar1 == L' ')) ||
          ((0x7f < (ushort)cVar1 &&
           (((cVar5 = (char32_t)(ushort)cVar1, cVar5 == L'\x85' || (cVar5 == L'\xa0')) ||
            (bVar3 = QChar::isSpace_helper(cVar5), bVar3))))))))) {
    pCVar4 = pCVar4 + 1;
  }
  TVar7.end = pCVar6;
  TVar7.begin = pCVar4;
  return TVar7;
}

Assistant:

const T *data() const noexcept { return ptr; }